

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O3

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improvePartitions(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                    *this)

{
  uint uVar1;
  _Bit_type *p_Var2;
  ulong *puVar3;
  _Bit_type *p_Var4;
  pointer pAVar5;
  size_t partition;
  ulong *puVar6;
  long *plVar7;
  size_t sVar8;
  pointer pVVar9;
  size_t sVar10;
  ulong uVar11;
  pointer puVar12;
  long lVar13;
  pointer pVVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  pointer pAVar23;
  ulong partitionId;
  size_t local_80;
  
  lVar13 = (long)(this->partitionGraph_).
                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->partitionGraph_).
                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar13 == 0) {
    puVar6 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  else {
    lVar13 = lVar13 >> 6;
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    puVar6 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar11 = 0;
    do {
      uVar19 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar19 = uVar11;
      }
      lVar22 = (long)uVar19 >> 6;
      uVar16 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
      uVar19 = 1L << ((byte)uVar11 & 0x3f);
      if ((p_Var2[lVar22 + uVar16 + 0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) == 0) {
        uVar20 = puVar6[lVar22 + (uVar16 - 1)] & ~uVar19;
      }
      else {
        uVar20 = uVar19 | puVar6[lVar22 + (uVar16 - 1)];
      }
      puVar6[lVar22 + (uVar16 - 1)] = uVar20;
      puVar3 = p_Var2 + lVar22 + uVar16 + 0xffffffffffffffff;
      *puVar3 = *puVar3 & ~uVar19;
      uVar11 = uVar11 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != uVar11);
  }
  puVar3 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  iVar15 = 0;
  if (uVar1 != 0 || puVar6 != puVar3) {
    iVar15 = 0;
    uVar11 = 0;
    do {
      iVar15 = iVar15 + (uint)((*puVar6 >> (uVar11 & 0x3f) & 1) != 0);
      iVar18 = (int)uVar11;
      puVar6 = puVar6 + (iVar18 == 0x3f);
      uVar11 = (ulong)(iVar18 + 1);
      if (iVar18 == 0x3f) {
        uVar11 = 0;
      }
    } while ((uint)uVar11 != uVar1 || puVar6 != puVar3);
  }
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0xf;
  plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  pVVar14 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
            vertices_.
            super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
           vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pVVar9 - (long)pVVar14 == 0x40) {
    uVar16 = 1;
    local_80 = 0;
  }
  else {
    lVar13 = 0x50;
    local_80 = 0;
    uVar11 = 0;
    do {
      uVar19 = uVar11 + 1;
      uVar16 = (long)pVVar9 - (long)pVVar14 >> 6;
      if (uVar19 < uVar16) {
        uVar20 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar20 = uVar11;
        }
        uVar21 = 1L << ((byte)uVar11 & 0x3f);
        puVar12 = (this->partitionGraph_).partitions_.
                  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (puVar12[uVar11]._M_h._M_element_count != 0) {
          uVar17 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
          partitionId = uVar19;
          lVar22 = lVar13;
          do {
            if (*(long *)((long)&(puVar12->_M_h)._M_buckets + lVar22) != 0) {
              p_Var2 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              if ((p_Var2[((long)uVar20 >> 6) + uVar17 + 0xffffffffffffffff] & uVar21) == 0) {
                uVar16 = partitionId + 0x3f;
                if (-1 < (long)partitionId) {
                  uVar16 = partitionId;
                }
                if ((p_Var2[((long)uVar16 >> 6) +
                            (ulong)((partitionId & 0x800000000000003f) < 0x8000000000000001) +
                            0xffffffffffffffff] >> (partitionId & 0x3f) & 1) == 0)
                goto LAB_0013b186;
              }
              sVar10 = PartitionGraph::frameOfPartition(&this->partitionGraph_,uVar11);
              sVar8 = PartitionGraph::frameOfPartition(&this->partitionGraph_,partitionId);
              if ((sVar10 == sVar8) &&
                 (sVar10 = improveBipartition(this,uVar11,partitionId), sVar10 != 0)) {
                p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                puVar6 = p_Var2 + ((long)uVar20 >> 6) + uVar17 + 0xffffffffffffffff;
                *puVar6 = *puVar6 | uVar21;
                uVar16 = partitionId + 0x3f;
                if (-1 < (long)partitionId) {
                  uVar16 = partitionId;
                }
                puVar6 = p_Var2 + ((long)uVar16 >> 6) +
                                  (ulong)((partitionId & 0x800000000000003f) < 0x8000000000000001) +
                                  0xffffffffffffffff;
                *puVar6 = *puVar6 | 1L << ((byte)partitionId & 0x3f);
                local_80 = local_80 + sVar10;
                HeuristicBase::logObj(&this->super_HeuristicBase);
              }
            }
LAB_0013b186:
            partitionId = partitionId + 1;
            pVVar14 = (this->partitionGraph_).
                      super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar9 = (this->partitionGraph_).
                     super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar16 = (long)pVVar9 - (long)pVVar14 >> 6;
            if (uVar16 <= partitionId) goto LAB_0013b1d5;
            puVar12 = (this->partitionGraph_).partitions_.
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar22 = lVar22 + 0x38;
          } while (puVar12[uVar11]._M_h._M_element_count != 0);
        }
        uVar16 = (long)pVVar9 - (long)pVVar14 >> 6;
      }
LAB_0013b1d5:
      lVar13 = lVar13 + 0x38;
      uVar11 = uVar19;
    } while (uVar19 < uVar16 - 1);
  }
  if (pVVar9 != pVVar14) {
    uVar11 = 0;
    do {
      uVar19 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar19 = uVar11;
      }
      uVar16 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
      if ((((this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
            [((long)uVar19 >> 6) + uVar16 + 0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) != 0) &&
         (sVar10 = splitPartition(this,uVar11), sVar10 != 0)) {
        puVar6 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 ((long)uVar19 >> 6) + uVar16 + 0xffffffffffffffff;
        *puVar6 = *puVar6 | 1L << ((byte)uVar11 & 0x3f);
        local_80 = local_80 + sVar10;
        HeuristicBase::logObj(&this->super_HeuristicBase);
      }
      uVar11 = uVar11 + 1;
      pVVar14 = (this->partitionGraph_).
                super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(this->partitionGraph_).
                     super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 6;
    } while (uVar11 < uVar16);
  }
  if (uVar16 != 0) {
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var4 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar11 = 0;
    do {
      uVar19 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar19 = uVar11;
      }
      lVar13 = (long)uVar19 >> 6;
      uVar20 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
      uVar19 = 1L << ((byte)uVar11 & 0x3f);
      if ((p_Var2[lVar13 + uVar20 + 0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) == 0) {
        uVar19 = ~uVar19 & p_Var4[lVar13 + uVar20 + 0xffffffffffffffff];
      }
      else {
        uVar19 = uVar19 | p_Var4[lVar13 + uVar20 + 0xffffffffffffffff];
      }
      p_Var4[lVar13 + uVar20 + 0xffffffffffffffff] = uVar19;
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
    p_Var2 = (this->changed_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var4 = (this->needsUpdate_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar11 = 0;
    do {
      uVar19 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar19 = uVar11;
      }
      uVar20 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
      if (((p_Var2[((long)uVar19 >> 6) + uVar20 + 0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) != 0)
         && ((p_Var4[((long)uVar19 >> 6) + uVar20 + 0xffffffffffffffff] &
             1L << ((byte)uVar11 & 0x3f)) != 0)) {
        pAVar5 = pVVar14[uVar11].to_.vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar23 = pVVar14[uVar11].to_.vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar23 != pAVar5;
            pAVar23 = pAVar23 + 1) {
          uVar19 = pAVar23->vertex_;
          uVar20 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar20 = uVar19;
          }
          p_Var2[((long)uVar20 >> 6) +
                 (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
               p_Var2[((long)uVar20 >> 6) +
                      (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] | 1L << ((byte)uVar19 & 0x3f);
        }
        pAVar5 = pVVar14[uVar11].from_.vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar23 = pVVar14[uVar11].from_.vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar23 != pAVar5;
            pAVar23 = pAVar23 + 1) {
          uVar19 = pAVar23->vertex_;
          uVar20 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar20 = uVar19;
          }
          p_Var2[((long)uVar20 >> 6) +
                 (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
               p_Var2[((long)uVar20 >> 6) +
                      (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] | 1L << ((byte)uVar19 & 0x3f);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar16);
  }
  return local_80;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improvePartitions()
{
    size_t numberOfMoves = 0;

    // update "dirty" flags.
    for (size_t idx = 0; idx < partitionGraph_.numberOfVertices(); ++idx) {
        needsUpdate_[idx] = changed_[idx];
        changed_[idx] = false;
    }

    {
        // complete info line.
        const auto numberOfUpdatedCells =
            std::accumulate(needsUpdate_.cbegin(), needsUpdate_.cend(), 0);
        std::cout << std::setw(WIDTH) << numberOfUpdatedCells << std::endl;
    }

    for (size_t partitionA = 0;
         partitionA < partitionGraph_.numberOfVertices() - 1; ++partitionA) {

        for (size_t partitionB = partitionA + 1;
             partitionB < partitionGraph_.numberOfVertices(); ++partitionB) {

            if (partitionGraph_.partitions_[partitionA].empty())
                break;
            if (partitionGraph_.partitions_[partitionB].empty())
                continue;

            // check if "dirty"
            if (!needsUpdate_[partitionA] && !needsUpdate_[partitionB]) {
                continue;
            }

            // check whether the partitions are in the same frame.
            // proximity (i.e. presence of an edge between them) will be
            // tested
            // implicitly in improveBipartition.
            if (partitionGraph_.frameOfPartition(partitionA) !=
                partitionGraph_.frameOfPartition(partitionB)) {
                continue;
            }

            const auto additionalMoves =
                improveBipartition(partitionA, partitionB);

            if (additionalMoves > 0) {
                changed_[partitionA] = true;
                changed_[partitionB] = true;
                numberOfMoves += additionalMoves;

                this->logObj();
            }
        }
    }

    // introduce new partitions.
    for (size_t partitionA = 0; partitionA < partitionGraph_.numberOfVertices();
         ++partitionA) {
        if (!needsUpdate_[partitionA]) {
            continue;
        }

        const auto additionalMoves = splitPartition(partitionA);

        if (additionalMoves > 0) {
            changed_[partitionA] = true;
            numberOfMoves += additionalMoves;

            this->logObj();
        }
    }

    // propagate "changed" flags along branching edges.
    // First, transfer flags to needsUpdate_ to prevent propagation
    // in the entire connected component.
    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition]) {
            needsUpdate_[partition] = true;
        } else {
            needsUpdate_[partition] = false;
        }
    }

    for (size_t partition = 0; partition < partitionGraph_.numberOfVertices();
         ++partition) {
        if (changed_[partition] && needsUpdate_[partition]) {

            for (auto it = partitionGraph_.verticesFromVertexBegin(partition);
                 it != partitionGraph_.verticesFromVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }

            for (auto it = partitionGraph_.verticesToVertexBegin(partition);
                 it != partitionGraph_.verticesToVertexEnd(partition); ++it) {
                changed_[*it] = true;
            }
        }
    }

    return numberOfMoves;
}